

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

size_t coll_seq_remove_all(coll_seq_t *seq,void *data)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *next;
  node_t_conflict *cur;
  node_t_conflict *prev;
  size_t count;
  void *data_local;
  coll_seq_t *seq_local;
  
  prev = (node_t_conflict *)0x0;
  cur = (node_t_conflict *)0x0;
  next = seq->head;
  while (next != (node_t_conflict *)0x0) {
    pcVar1 = next->next;
    if (next->data == data) {
      if (cur == (node_t_conflict *)0x0) {
        seq->head = pcVar1;
      }
      else {
        cur->next = pcVar1;
      }
      free(next);
      seq->len = seq->len - 1;
      prev = (node_t_conflict *)((long)&prev->data + 1);
      next = pcVar1;
    }
    else {
      cur = next;
      next = pcVar1;
    }
  }
  return (size_t)prev;
}

Assistant:

size_t coll_seq_remove_all(coll_seq_t *seq, void *data) {
    size_t count = 0;
    node_t *prev = NULL, *cur = seq->head;
    while (cur) {
        node_t *next = cur->next;
        if (cur->data == data) {
            if (!prev) {
                seq->head = next;
            } else {
                prev->next = next;
            }
            free(cur);
            --(seq->len);
            ++count;
        } else {
            prev = cur;
        }
        cur = next;
    }
    return count;
}